

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O2

bool __thiscall HPack::Decoder::decodeIndexedField(Decoder *this,BitIStream *inputStream)

{
  bool bVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  byte unaff_BPL;
  long in_FS_OFFSET;
  quint32 index;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char> local_48;
  quint32 local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  sVar2 = BitIStream::read(inputStream,(int)&local_24,in_RDX,in_RCX);
  if ((char)sVar2 == '\0') {
    BitIStream::error(inputStream);
  }
  else if (local_24 != 0) {
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char *)0x0;
    local_68.size = 0;
    bVar1 = FieldLookupTable::field
                      (&this->lookupTable,local_24,(QByteArray *)&local_48,(QByteArray *)&local_68);
    if (bVar1) {
      unaff_BPL = processDecodedField(this,(BitPattern)0x101,(QByteArray *)&local_48,
                                      (QByteArray *)&local_68);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
    if (bVar1) goto LAB_001cb09d;
  }
  unaff_BPL = 0;
LAB_001cb09d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool Decoder::decodeIndexedField(BitIStream &inputStream)
{
    quint32 index = 0;
    if (inputStream.read(&index)) {
        if (!index) {
            // "The index value of 0 is not used.
            //  It MUST be treated as a decoding
            //  error if found in an indexed header
            //  field representation."
            return false;
        }

        QByteArray name, value;
        if (lookupTable.field(index, &name, &value))
            return processDecodedField(Indexed, name, value);
    } else {
        handleStreamError(inputStream);
    }

    return false;
}